

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

bool __thiscall r_exec::Group::load(Group *this,View *view,Code *object)

{
  atomic_int_fast64_t *paVar1;
  Controller *pCVar2;
  View *pVVar3;
  MDLController *pMVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  Controller *pCVar10;
  mapped_type *pmVar11;
  MDLController *this_00;
  Group *pGVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  string str;
  Code *local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [32];
  
  local_60 = object;
  (*(object->super__Object)._vptr__Object[4])(object,0);
  uVar5 = r_code::Atom::getDescriptor();
  switch(uVar5) {
  case 0xc4:
    iVar7 = (*(object->super__Object)._vptr__Object[10])(object);
    if ((short)iVar7 != 0) {
      uVar13 = 0;
      do {
        iVar7 = (*(local_60->super__Object)._vptr__Object[9])(local_60,uVar13 & 0xffff);
        r_code::list<r_code::Code_*>::push_back
                  ((list<r_code::Code_*> *)(CONCAT44(extraout_var,iVar7) + 0x18),&local_60);
        uVar13 = uVar13 + 1;
        uVar8 = (*(local_60->super__Object)._vptr__Object[10])();
      } while (uVar13 < (uVar8 & 0xffff));
    }
  case 0xc3:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->other_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    break;
  case 200:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->group_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,7);
    fVar14 = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,8);
    local_4c = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,5);
    local_50 = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    local_54 = (float)r_code::Atom::asFloat();
    local_58 = r_exec::View::get_vis(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,4);
    fVar15 = (float)r_code::Atom::asFloat();
    if (((local_4c < fVar14) && (local_54 < local_50)) && (fVar15 < local_58)) {
      bVar6 = r_exec::View::get_cov(view);
      local_48._0_8_ = this;
      pmVar9 = std::__detail::
               _Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_60[6].markers.free_cell_count,(key_type *)local_48);
      *pmVar9 = bVar6;
    }
    break;
  case 0xc9:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    this_00 = (MDLController *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)this_00,&view->super_View);
    goto LAB_0016e121;
  case 0xca:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    r_code::Utils::GetString<r_code::Code>
              ((string *)local_48,(Code *)(view->super_View).object.object,1);
    pCVar10 = CPPPrograms::New((string *)local_48,&view->super_View);
    if (pCVar10 != (Controller *)0x0) {
      pCVar2 = (Controller *)(view->controller).object;
      if (pCVar2 != pCVar10) {
        if (pCVar2 != (Controller *)0x0) {
          LOCK();
          paVar1 = &(pCVar2->super__Object).refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if ((pCVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
            (*(pCVar2->super__Object)._vptr__Object[1])();
          }
        }
        (view->controller).object = &pCVar10->super__Object;
        LOCK();
        paVar1 = &(pCVar10->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
      fVar14 = r_exec::View::get_act(view);
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,3);
      fVar15 = (float)r_code::Atom::asFloat();
      if (fVar15 < fVar14) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,5);
        fVar14 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,6);
        fVar15 = (float)r_code::Atom::asFloat();
        if (fVar15 < fVar14) {
          (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(this,7);
          fVar14 = (float)r_code::Atom::asFloat();
          (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(this,8);
          fVar15 = (float)r_code::Atom::asFloat();
          if (fVar15 < fVar14) {
            (*(pCVar10->super__Object)._vptr__Object[5])(pCVar10);
          }
        }
      }
    }
    if ((key_type)local_48._0_8_ != (key_type)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
    if (pCVar10 == (Controller *)0x0) {
      return false;
    }
    break;
  case 0xcb:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->input_less_ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    this_00 = (MDLController *)operator_new(200);
    InputLessPGMController::InputLessPGMController
              ((InputLessPGMController *)this_00,&view->super_View);
    goto LAB_0016e121;
  case 0xcc:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->anti_ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    this_00 = (MDLController *)operator_new(200);
    AntiPGMController::AntiPGMController((AntiPGMController *)this_00,&view->super_View);
LAB_0016e121:
    pMVar4 = (MDLController *)(view->controller).object;
    if (pMVar4 != this_00) {
      if (pMVar4 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pMVar4->super_HLPController).super_OController.super_Controller.super__Object.refCount.
            super___atomic_base<long>._M_i < 1) {
          (*(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_00;
      LOCK();
      paVar1 = &(this_00->super_HLPController).super_OController.super_Controller.super__Object.
                refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
LAB_0016e392:
    fVar14 = r_exec::View::get_act(view);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,3);
    fVar15 = (float)r_code::Atom::asFloat();
    if (fVar15 < fVar14) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,5);
      fVar14 = (float)r_code::Atom::asFloat();
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,6);
      fVar15 = (float)r_code::Atom::asFloat();
      if (fVar15 < fVar14) {
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,7);
        fVar14 = (float)r_code::Atom::asFloat();
        (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[5])(this,8);
        fVar15 = (float)r_code::Atom::asFloat();
        if (fVar15 < fVar14) {
          (*(this_00->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[5])(this_00);
        }
      }
    }
    break;
  case 0xcd:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    this_00 = (MDLController *)operator_new(0x1e8);
    CSTController::CSTController((CSTController *)this_00,&view->super_View);
    pMVar4 = (MDLController *)(view->controller).object;
    if (pMVar4 != this_00) {
      if (pMVar4 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pMVar4->super_HLPController).super_OController.super_Controller.super__Object.refCount.
            super___atomic_base<long>._M_i < 1) {
          (*(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_00;
      LOCK();
      paVar1 = &(this_00->super_HLPController).super_OController.super_Controller.super__Object.
                refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    pGVar12 = get_secondary_group(this);
    CSTController::set_secondary_host((CSTController *)this_00,pGVar12);
    goto LAB_0016e392;
  case 0xce:
    local_48._0_8_ = r_exec::View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)local_48);
    pVVar3 = (View *)pmVar11->object;
    if (pVVar3 != view) {
      if (pVVar3 != (View *)0x0) {
        LOCK();
        paVar1 = &(pVVar3->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pVVar3->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(pVVar3->super_View).super__Object._vptr__Object[1])();
        }
      }
      pmVar11->object = (_Object *)view;
      if (view != (View *)0x0) {
        LOCK();
        paVar1 = &(view->super_View).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    this_00 = MDLController::New(view,(bool *)local_48);
    pMVar4 = (MDLController *)(view->controller).object;
    if (pMVar4 != this_00) {
      if (pMVar4 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pMVar4->super_HLPController).super_OController.super_Controller.super__Object.refCount.
            super___atomic_base<long>._M_i < 1) {
          (*(pMVar4->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[1])();
        }
      }
      (view->controller).object = (_Object *)this_00;
      if (this_00 != (MDLController *)0x0) {
        LOCK();
        paVar1 = &(this_00->super_HLPController).super_OController.super_Controller.super__Object.
                  refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
      }
    }
    if (local_48[0] == true) {
      pGVar12 = get_secondary_group(this);
      load_secondary_mdl_controller(pGVar12,view);
    }
    goto LAB_0016e392;
  }
  return true;
}

Assistant:

bool Group::load(View *view, Code *object)
{
    switch (object->code(0).getDescriptor()) {
    case Atom::GROUP: {
        group_views[view->get_oid()] = view;
        // init viewing_group.
        bool viewing_c_active = get_c_act() > get_c_act_thr();
        bool viewing_c_salient = get_c_sln() > get_c_sln_thr();
        bool viewed_visible = view->get_vis() > get_vis_thr();

        if (viewing_c_active && viewing_c_salient && viewed_visible) { // visible group in a c-salient, c-active group.
            ((Group *)object)->viewing_groups[this] = view->get_cov();    // init the group's viewing groups.
        }

        break;
    }

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view); // now will be added to the deadline at start time.

        if (!c) {
            return false;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::COMPOSITE_STATE: {
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MODEL: {
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->load_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MARKER: // populate the marker set of the referenced objects.
        for (uint64_t i = 0; i < object->references_size(); ++i) {
            object->get_reference(i)->markers.push_back(object);
        }

        other_views[view->get_oid()] = view;
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        break;
    }

    return true;
}